

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkDirectoriesCommand.h
# Opt level: O0

cmCommand * __thiscall cmLinkDirectoriesCommand::Clone(cmLinkDirectoriesCommand *this)

{
  cmCommand *this_00;
  cmLinkDirectoriesCommand *this_local;
  
  this_00 = (cmCommand *)operator_new(0x30);
  cmLinkDirectoriesCommand((cmLinkDirectoriesCommand *)this_00);
  return this_00;
}

Assistant:

cmCommand* Clone() CM_OVERRIDE { return new cmLinkDirectoriesCommand; }